

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnlineProofChecker.h
# Opt level: O2

void __thiscall Minisat::OnlineProofChecker::detachClause(OnlineProofChecker *this,CRef cr)

{
  long lVar1;
  ulong uVar2;
  Watcher local_30;
  
  lVar1 = *(long *)(this + 8);
  uVar2 = (ulong)cr;
  local_30.blocker.x = *(int *)(lVar1 + 0xc + uVar2 * 4);
  local_30.cref = cr;
  removeUnSort<Minisat::vec<Minisat::Watcher>,Minisat::Watcher>
            ((vec<Minisat::Watcher> *)
             (((long)*(int *)(lVar1 + 8 + uVar2 * 4) ^ 1U) * 0x10 + *(long *)(this + 0x58)),
             &local_30);
  local_30.blocker.x = *(int *)(lVar1 + 8 + uVar2 * 4);
  local_30.cref = cr;
  removeUnSort<Minisat::vec<Minisat::Watcher>,Minisat::Watcher>
            ((vec<Minisat::Watcher> *)
             (((long)*(int *)(lVar1 + 0xc + uVar2 * 4) ^ 1U) * 0x10 + *(long *)(this + 0x58)),
             &local_30);
  return;
}

Assistant:

inline void OnlineProofChecker::detachClause(CRef cr)
{
    const Clause &c = ca[cr];
    removeUnSort(watches[~c[0]], Watcher(cr, c[1]));
    removeUnSort(watches[~c[1]], Watcher(cr, c[0]));
}